

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O2

v4sf * cfftf1_ps(int n,v4sf *input_readonly,v4sf *work1,v4sf *work2,float *wa,int *ifac,int isign)

{
  int iVar1;
  int iVar2;
  int ido;
  int iVar3;
  int iVar4;
  long lVar5;
  v4sf *ch;
  int l1;
  bool bVar6;
  float fsign;
  
  ch = work2;
  if (input_readonly == work2) {
    ch = work1;
  }
  if ((work1 != work2) && (ch != input_readonly)) {
    iVar1 = ifac[1];
    fsign = (float)isign;
    iVar3 = 0;
    lVar5 = 2;
    l1 = 1;
    while( true ) {
      if ((long)iVar1 + 1 < lVar5) {
        return input_readonly;
      }
      iVar2 = ifac[lVar5];
      if (3 < iVar2 - 2U) break;
      ido = (n / (iVar2 * l1)) * 2;
      switch(iVar2) {
      case 2:
        passf2_ps(ido,l1,input_readonly,ch,wa + iVar3,fsign);
        break;
      case 3:
        passf3_ps(ido,l1,input_readonly,ch,wa + iVar3,wa + (iVar3 + ido),fsign);
        break;
      case 4:
        passf4_ps(ido,l1,input_readonly,ch,wa + iVar3,wa + (iVar3 + ido),wa + (iVar3 + ido + ido),
                  fsign);
        break;
      case 5:
        iVar4 = iVar3 + ido + ido;
        passf5_ps(ido,l1,input_readonly,ch,wa + iVar3,wa + (iVar3 + ido),wa + iVar4,
                  wa + (iVar4 + ido),fsign);
      }
      iVar3 = iVar3 + ido * (iVar2 + -1);
      bVar6 = ch == work2;
      input_readonly = work1;
      ch = work2;
      if (bVar6) {
        input_readonly = work2;
        ch = work1;
      }
      lVar5 = lVar5 + 1;
      l1 = iVar2 * l1;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                  ,0x4a1,
                  "v4sf *cfftf1_ps(int, const v4sf *, v4sf *, v4sf *, const float *, const int *, int)"
                 );
  }
  __assert_fail("in != out && work1 != work2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                ,0x487,
                "v4sf *cfftf1_ps(int, const v4sf *, v4sf *, v4sf *, const float *, const int *, int)"
               );
}

Assistant:

v4sf *cfftf1_ps(int n, const v4sf *input_readonly, v4sf *work1, v4sf *work2, const float *wa, const int *ifac, int isign) {
  v4sf *in  = (v4sf*)input_readonly;
  v4sf *out = (in == work2 ? work1 : work2); 
  int nf = ifac[1], k1;
  int l1 = 1;
  int iw = 0;
  assert(in != out && work1 != work2);
  for (k1=2; k1<=nf+1; k1++) {
    int ip = ifac[k1];
    int l2 = ip*l1;
    int ido = n / l2;
    int idot = ido + ido;
    switch (ip) {
      case 5: {
        int ix2 = iw + idot;
        int ix3 = ix2 + idot;
        int ix4 = ix3 + idot;
        passf5_ps(idot, l1, in, out, &wa[iw], &wa[ix2], &wa[ix3], &wa[ix4], isign);
      } break;
      case 4: {
        int ix2 = iw + idot;
        int ix3 = ix2 + idot;
        passf4_ps(idot, l1, in, out, &wa[iw], &wa[ix2], &wa[ix3], isign);
      } break;
      case 2: {
        passf2_ps(idot, l1, in, out, &wa[iw], isign);
      } break;
      case 3: {
        int ix2 = iw + idot;
        passf3_ps(idot, l1, in, out, &wa[iw], &wa[ix2], isign);
      } break;
      default:
        assert(0);
    }
    l1 = l2;
    iw += (ip - 1)*idot;
    if (out == work2) {
      out = work1; in = work2;
    } else {
      out = work2; in = work1;
    }
  }

  return in; /* this is in fact the output .. */
}